

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrl::setPort(QUrl *this,int port)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QUrl *in_stack_ffffffffffffffb0;
  QString *in_stack_ffffffffffffffc0;
  ErrorCode in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  detach(in_stack_ffffffffffffffb0);
  QUrlPrivate::clearError((QUrlPrivate *)0x2fc1eb);
  if ((in_ESI < -1) || (0xffff < in_ESI)) {
    QString::number(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    QUrlPrivate::setError
              ((QUrlPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc0,(qsizetype)in_RDI);
    QString::~QString((QString *)0x2fc245);
    in_ESI = -1;
  }
  *(int *)(*in_RDI + 4) = in_ESI;
  if (in_ESI != -1) {
    *(byte *)(*in_RDI + 0xb8) = *(byte *)(*in_RDI + 0xb8) | 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setPort(int port)
{
    detach();
    d->clearError();

    if (port < -1 || port > 65535) {
        d->setError(QUrlPrivate::InvalidPortError, QString::number(port), 0);
        port = -1;
    }

    d->port = port;
    if (port != -1)
        d->sectionIsPresent |= QUrlPrivate::Host;
}